

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void test_read_uint32_iterator(uint8_t type)

{
  uint32_t uVar1;
  roaring_bitmap_t *r;
  roaring_uint32_iterator_t *it;
  uint32_t i;
  ulong uVar2;
  uint32_t buffer [1];
  uint32_t ref_count;
  uint32_t *ref_values;
  
  test_iterator_generate_data(&ref_values,&ref_count);
  r = roaring_bitmap_create();
  for (uVar2 = 0; ref_count != uVar2; uVar2 = uVar2 + 1) {
    roaring_bitmap_add(r,ref_values[uVar2]);
  }
  if (type != 0xff) {
    convert_all_containers(r,type);
  }
  it = roaring_iterator_create(r);
  uVar1 = roaring_uint32_iterator_read(it,buffer,0);
  _assert_true((ulong)(uVar1 == 0),"got == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf9b);
  _assert_true((ulong)it->has_value,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf9c);
  _assert_true((ulong)(it->current_value == 0),"iter->current_value == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf9d);
  roaring_uint32_iterator_free(it);
  read_compare(r,ref_values,ref_count,1);
  read_compare(r,ref_values,ref_count,2);
  read_compare(r,ref_values,ref_count,7);
  read_compare(r,ref_values,ref_count,ref_count - 1);
  read_compare(r,ref_values,ref_count,ref_count);
  read_compare(r,ref_values,ref_count,0xffffffff);
  roaring_bitmap_free(r);
  free(ref_values);
  return;
}

Assistant:

void test_read_uint32_iterator(uint8_t type) {
    uint32_t *ref_values;
    uint32_t ref_count;
    test_iterator_generate_data(&ref_values, &ref_count);

    roaring_bitmap_t *r = roaring_bitmap_create();
    for (uint32_t i = 0; i < ref_count; i++) {
        roaring_bitmap_add(r, ref_values[i]);
    }
    if (type != UINT8_MAX) {
        convert_all_containers(r, type);
    }

    roaring_uint32_iterator_t *iter = roaring_iterator_create(r);
    uint32_t buffer[1];
    uint32_t got = roaring_uint32_iterator_read(iter, buffer, 0);
    assert_true(got == 0);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 0);
    roaring_uint32_iterator_free(iter);

    read_compare(r, ref_values, ref_count, 1);
    read_compare(r, ref_values, ref_count, 2);
    read_compare(r, ref_values, ref_count, 7);
    read_compare(r, ref_values, ref_count, ref_count - 1);
    read_compare(r, ref_values, ref_count, ref_count);
    read_compare(r, ref_values, ref_count, UINT32_MAX);  // special value

    roaring_bitmap_free(r);
    free(ref_values);
}